

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::drawAndVerifyResult
          (LayoutBindingRenderCase *this,Vec4 *expectedColor)

{
  ostringstream *poVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  RenderTarget *pRVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  RGBA compareThreshold;
  Surface result;
  Surface reference;
  RGBA local_1ec;
  TextureFormat local_1e8;
  Surface local_1e0;
  Surface local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  undefined4 extraout_var_00;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar7->m_width;
  if (0xff < iVar3) {
    iVar3 = 0x100;
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar10 = pRVar7->m_height;
  if (0xff < pRVar7->m_height) {
    iVar10 = 0x100;
  }
  tcu::Surface::Surface(&local_1c8,iVar3,iVar10);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var_00,iVar3);
  bVar9 = 8 - *(char *)(lVar8 + 8);
  uVar4 = 0;
  if (0 < *(int *)(lVar8 + 0x14)) {
    uVar4 = 0x1000000 << (8U - (char)*(int *)(lVar8 + 0x14) & 0x1f);
  }
  uVar13 = 0x100 << (8U - *(char *)(lVar8 + 0xc) & 0x1f) | 1 << (bVar9 & 0x1f);
  uVar4 = 0x10000 << (8U - *(char *)(lVar8 + 0x10) & 0x1f) | uVar13 | uVar4;
  uVar11 = 2 << (bVar9 & 0x1f) & 0x1fe;
  if (0xfe < uVar11) {
    uVar11 = 0xff;
  }
  uVar13 = uVar13 >> 7 & 0x1fe;
  if (0xfe < uVar13) {
    uVar13 = 0xff;
  }
  uVar12 = uVar4 >> 0xf & 0x1fe;
  if (0xfe < uVar12) {
    uVar12 = 0xff;
  }
  uVar4 = uVar4 >> 0x17 & 0xfffffffe;
  if (0xfe < uVar4) {
    uVar4 = 0xff;
  }
  local_1ec.m_value = uVar12 << 0x10 | uVar13 << 8 | uVar11 | uVar4 << 0x18;
  (**(code **)(lVar6 + 0x188))(0x4000);
  (**(code **)(lVar6 + 0x568))(4,6,0x1403,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Drawing failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x283);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar7->m_width;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (0xff < iVar3) {
    iVar3 = 0x100;
  }
  iVar10 = 0x100;
  if (pRVar7->m_height < 0x100) {
    iVar10 = pRVar7->m_height;
  }
  tcu::Surface::Surface(&local_1e0,iVar3,iVar10);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Reading pixels",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1e8.order = RGBA;
  local_1e8.type = UNORM_INT8;
  if ((void *)local_1e0.m_pixels.m_cap != (void *)0x0) {
    local_1e0.m_pixels.m_cap = (size_t)local_1e0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1e8,local_1e0.m_width,local_1e0.m_height,1,
             (void *)local_1e0.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Read pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x289);
  local_1e8.order = RGBA;
  local_1e8.type = UNORM_INT8;
  if ((void *)local_1c8.m_pixels.m_cap != (void *)0x0) {
    local_1c8.m_pixels.m_cap = (size_t)local_1c8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1e8,local_1c8.m_width,local_1c8.m_height,1,
             (void *)local_1c8.m_pixels.m_cap);
  tcu::clear((PixelBufferAccess *)local_1b0,expectedColor);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying output image, fragment output color is ",0x31);
  tcu::operator<<((ostream *)poVar1,expectedColor);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  bVar2 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "Render result","Result verification",&local_1c8,&local_1e0,&local_1ec,
                     COMPARE_LOG_RESULT);
  tcu::Surface::~Surface(&local_1e0);
  tcu::Surface::~Surface(&local_1c8);
  return bVar2;
}

Assistant:

bool LayoutBindingRenderCase::drawAndVerifyResult (const Vec4& expectedColor)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			reference			(getRenderWidth(), getRenderHeight());

	// the point of these test is to check layout_binding. For this purpose, we can use quite
	// large thresholds.
	const tcu::RGBA			surfaceThreshold	= m_context.getRenderContext().getRenderTarget().getPixelFormat().getColorThreshold();
	const tcu::RGBA			compareThreshold	= tcu::RGBA(de::clamp(2 * surfaceThreshold.getRed(),   0, 255),
															de::clamp(2 * surfaceThreshold.getGreen(), 0, 255),
															de::clamp(2 * surfaceThreshold.getBlue(),  0, 255),
															de::clamp(2 * surfaceThreshold.getAlpha(), 0, 255));

	gl.clear(GL_COLOR_BUFFER_BIT);

	// Draw
	gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Drawing failed");

	// Verify
	tcu::Surface result(getRenderWidth(), getRenderHeight());
	m_testCtx.getLog() << TestLog::Message << "Reading pixels" << TestLog::EndMessage;
	glu::readPixels(m_context.getRenderContext(), 0, 0, result.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	tcu::clear(reference.getAccess(), expectedColor);
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output image, fragment output color is " << expectedColor << tcu::TestLog::EndMessage;

	return tcu::pixelThresholdCompare(m_testCtx.getLog(), "Render result", "Result verification", reference, result, compareThreshold, tcu::COMPARE_LOG_RESULT);
}